

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordDict.h
# Opt level: O0

void __thiscall Word::Word(Word *this,string *w)

{
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  string *local_18;
  string *w_local;
  Word *this_local;
  
  local_18 = w;
  w_local = (string *)this;
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shared_ptr(&this->word);
  this->count = 1;
  std::make_shared<std::__cxx11::string,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(&this->word,&local_28);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr(&local_28);
  return;
}

Assistant:

Word::Word(std::string &&w)
{
    count = 1;
    word = std::make_shared<std::string>(w);
}